

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,REF_GRID ref_grid)

{
  REF_INT reference;
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_MIGRATE pRVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  REF_INT *vector;
  ulong uVar7;
  int iVar8;
  REF_INT RVar9;
  REF_ADJ *ref_adj_ptr;
  long lVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  REF_STATUS RVar14;
  ulong uVar15;
  REF_CELL *ppRVar16;
  undefined8 uStack_70;
  
  ref_node = ref_grid->node;
  pRVar4 = (REF_MIGRATE)malloc(0x48);
  *ref_migrate_ptr = pRVar4;
  if (pRVar4 == (REF_MIGRATE)0x0) {
    pcVar13 = "malloc *ref_migrate_ptr of REF_MIGRATE_STRUCT NULL";
    uStack_70 = 0x43;
LAB_00210917:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uStack_70,"ref_migrate_create",pcVar13);
    RVar14 = 2;
  }
  else {
    pRVar4->grid = ref_grid;
    uVar3 = ref_adj_create(&pRVar4->parent_local);
    if (uVar3 == 0) {
      uVar3 = ref_adj_create(&pRVar4->parent_part);
      if (uVar3 == 0) {
        ref_adj_ptr = &pRVar4->conn;
        uVar3 = ref_adj_create(ref_adj_ptr);
        if (uVar3 == 0) {
          uVar3 = ref_node->max;
          uVar15 = (ulong)uVar3;
          pRVar4->max = uVar3;
          if ((int)uVar3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x50,"ref_migrate_create","malloc ref_migrate->global of REF_GLOB negative");
            return 1;
          }
          pRVar5 = (REF_GLOB *)malloc(uVar15 * 8);
          pRVar4->global = pRVar5;
          if (pRVar5 == (REF_GLOB *)0x0) {
            pcVar13 = "malloc ref_migrate->global of REF_GLOB NULL";
            uStack_70 = 0x50;
          }
          else {
            for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
              pRVar5[uVar7] = -1;
            }
            pRVar6 = (REF_DBL *)malloc(uVar15 * 0x18);
            pRVar4->xyz = pRVar6;
            if (pRVar6 == (REF_DBL *)0x0) {
              pcVar13 = "malloc ref_migrate->xyz of REF_DBL NULL";
              uStack_70 = 0x51;
            }
            else {
              pRVar6 = (REF_DBL *)malloc(uVar15 * 8);
              pRVar4->weight = pRVar6;
              if (pRVar6 == (REF_DBL *)0x0) {
                pcVar13 = "malloc ref_migrate->weight of REF_DBL NULL";
                uStack_70 = 0x52;
              }
              else {
                vector = (REF_INT *)malloc(uVar15 * 4);
                pRVar4->age = vector;
                if (vector != (REF_INT *)0x0) {
                  lVar11 = 8;
                  lVar12 = lVar11;
                  for (lVar10 = 0; lVar10 < (int)uVar15; lVar10 = lVar10 + 1) {
                    if ((-1 < ref_node->global[lVar10]) &&
                       (ref_node->ref_mpi->id == ref_node->part[lVar10])) {
                      pRVar4->global[lVar10] = ref_node->global[lVar10];
                      RVar9 = (REF_INT)lVar10;
                      uVar3 = ref_adj_add(pRVar4->parent_local,RVar9,RVar9);
                      if (uVar3 != 0) {
                        uVar15 = (ulong)uVar3;
                        pcVar13 = "add";
                        uStack_70 = 0x59;
                        goto LAB_0021098c;
                      }
                      uVar3 = ref_adj_add(pRVar4->parent_part,RVar9,ref_node->part[lVar10]);
                      if (uVar3 != 0) {
                        uVar15 = (ulong)uVar3;
                        pcVar13 = "add";
                        uStack_70 = 0x5c;
                        goto LAB_0021098c;
                      }
                      pRVar6 = ref_node->real;
                      pRVar1 = pRVar4->xyz;
                      *(undefined8 *)((long)pRVar1 + lVar12 * 2 + -0x10) =
                           *(undefined8 *)((long)pRVar6 + lVar11 * 2 + -0x10);
                      *(undefined8 *)((long)pRVar1 + lVar12 * 2 + -8) =
                           *(undefined8 *)((long)pRVar6 + lVar11 * 2 + -8);
                      *(undefined8 *)((long)pRVar1 + lVar12 * 2) =
                           *(undefined8 *)((long)pRVar6 + lVar11 * 2);
                      pRVar4->weight[lVar10] = 1.0;
                      vector = pRVar4->age;
                      vector[lVar10] = ref_node->age[lVar10];
                      uVar15 = (ulong)(uint)ref_node->max;
                    }
                    lVar12 = lVar12 + 0xc;
                    lVar11 = lVar11 + 0x3c;
                  }
                  uVar3 = ref_node_ghost_int(ref_node,vector,1);
                  if (uVar3 == 0) {
                    ppRVar16 = ref_grid->cell + 3;
                    lVar11 = 3;
                    do {
                      if (lVar11 == 0x10) {
                        return 0;
                      }
                      pRVar2 = *ppRVar16;
                      for (iVar8 = 0; iVar8 < pRVar2->max; iVar8 = iVar8 + 1) {
                        if (pRVar2->c2n[(long)pRVar2->size_per * (long)iVar8] != -1) {
                          lVar12 = 0;
                          while (lVar12 < pRVar2->edge_per) {
                            lVar10 = (long)pRVar2->size_per * (long)iVar8;
                            RVar9 = pRVar2->c2n[pRVar2->e2n[lVar12 * 2] + lVar10];
                            reference = pRVar2->c2n
                                        [(long)(int)lVar10 + (long)pRVar2->e2n[lVar12 * 2 + 1]];
                            uVar3 = ref_adj_add_uniquely(*ref_adj_ptr,RVar9,reference);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                     ,0x6f,"ref_migrate_create",(ulong)uVar3,"uniq");
                              return uVar3;
                            }
                            uVar3 = ref_adj_add_uniquely(*ref_adj_ptr,reference,RVar9);
                            lVar12 = lVar12 + 1;
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                     ,0x71,"ref_migrate_create",(ulong)uVar3,"uniq");
                              return uVar3;
                            }
                          }
                        }
                      }
                      ppRVar16 = ref_grid->cell + lVar11 + 1;
                      lVar11 = lVar11 + 1;
                    } while( true );
                  }
                  uVar15 = (ulong)uVar3;
                  pcVar13 = "ghost age for edge weights";
                  uStack_70 = 0x65;
                  goto LAB_0021098c;
                }
                pcVar13 = "malloc ref_migrate->age of REF_INT NULL";
                uStack_70 = 0x53;
              }
            }
          }
          goto LAB_00210917;
        }
        uVar15 = (ulong)uVar3;
        pcVar13 = "make adj";
        uStack_70 = 0x4b;
      }
      else {
        uVar15 = (ulong)uVar3;
        pcVar13 = "make adj";
        uStack_70 = 0x4a;
      }
    }
    else {
      uVar15 = (ulong)uVar3;
      pcVar13 = "make adj";
      uStack_70 = 0x49;
    }
LAB_0021098c:
    RVar14 = (REF_STATUS)uVar15;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uStack_70,"ref_migrate_create",uVar15,pcVar13);
  }
  return RVar14;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,
                                      REF_GRID ref_grid) {
  REF_MIGRATE ref_migrate;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT group, cell, cell_edge, n0, n1;

  ref_malloc(*ref_migrate_ptr, 1, REF_MIGRATE_STRUCT);

  ref_migrate = *ref_migrate_ptr;

  ref_migrate_grid(ref_migrate) = ref_grid;

  RSS(ref_adj_create(&(ref_migrate_parent_local(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_parent_part(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_conn(ref_migrate))), "make adj");

  ref_migrate_max(ref_migrate) = ref_node_max(ref_node);

  ref_malloc_init(ref_migrate->global, ref_migrate_max(ref_migrate), REF_GLOB,
                  REF_EMPTY);
  ref_malloc(ref_migrate->xyz, 3 * ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->weight, ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->age, ref_migrate_max(ref_migrate), REF_INT);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      ref_migrate_global(ref_migrate, node) = ref_node_global(ref_node, node);
      RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), node, node),
          "add");
      RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), node,
                      ref_node_part(ref_node, node)),
          "add");
      ref_migrate_xyz(ref_migrate, 0, node) = ref_node_xyz(ref_node, 0, node);
      ref_migrate_xyz(ref_migrate, 1, node) = ref_node_xyz(ref_node, 1, node);
      ref_migrate_xyz(ref_migrate, 2, node) = ref_node_xyz(ref_node, 2, node);
      ref_migrate_weight(ref_migrate, node) = 1.0;
      ref_migrate_age(ref_migrate, node) = ref_node_age(ref_node, node);
    }
  }
  RSS(ref_node_ghost_int(ref_node, (ref_migrate->age), 1),
      "ghost age for edge weights");

  /* 2d included for twod */
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        /* need ghost nodes for agglomeration */
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n0, n1),
            "uniq");
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n1, n0),
            "uniq");
      }
    }
  }

  return REF_SUCCESS;
}